

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::OptionInterpreter
          (OptionInterpreter *this,DescriptorBuilder *builder)

{
  LogMessage *pLVar1;
  LogMessage local_38;
  Voidify local_25 [13];
  DescriptorBuilder *local_18;
  DescriptorBuilder *builder_local;
  OptionInterpreter *this_local;
  
  this->builder_ = builder;
  local_18 = builder;
  builder_local = (DescriptorBuilder *)this;
  absl::lts_20250127::
  flat_hash_map<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::flat_hash_map(&this->interpreted_paths_);
  absl::lts_20250127::
  flat_hash_map<std::vector<int,_std::allocator<int>_>,_int,_absl::lts_20250127::hash_internal::Hash<std::vector<int,_std::allocator<int>_>_>,_std::equal_to<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
  ::flat_hash_map(&this->repeated_option_counts_);
  DynamicMessageFactory::DynamicMessageFactory(&this->dynamic_factory_);
  if (this->builder_ != (DescriptorBuilder *)0x0) {
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc"
             ,0x2482,"builder_");
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
  absl::lts_20250127::log_internal::Voidify::operator&&(local_25,pLVar1);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

DescriptorBuilder::OptionInterpreter::OptionInterpreter(
    DescriptorBuilder* builder)
    : builder_(builder) {
  ABSL_CHECK(builder_);
}